

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall
S2Builder::EdgeChainSimplifier::OutputAllEdges(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  pointer *pppVar1;
  ulong *puVar2;
  pointer piVar3;
  pointer ppVar4;
  iterator iVar5;
  iterator iVar6;
  ulong uVar7;
  uint uVar8;
  pair<int,_int> *ppVar9;
  int *piVar10;
  EdgeId e_1;
  long lVar11;
  long lVar12;
  EdgeId e;
  int iVar13;
  ulong uVar14;
  pair<const_std::pair<int,_int>_*,_const_std::pair<int,_int>_*> pVar15;
  int local_58;
  VertexId local_54;
  vector<int,std::allocator<int>> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_40;
  VertexId local_38;
  VertexId local_34;
  
  piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar4 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = v0;
  local_54 = v1;
  local_38 = v1;
  local_34 = v0;
  pVar15 = std::
           __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                     (ppVar4 + piVar3[v0],ppVar4 + piVar3[(long)v0 + 1]);
  ppVar4 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (long)pVar15.second - (long)ppVar4;
  uVar8 = (int)uVar14 * 0x20000000 | (uint)((ulong)((long)pVar15.first - (long)ppVar4) >> 3);
  iVar13 = (int)(uVar14 >> 3) - uVar8;
  if (iVar13 != 0) {
    local_40 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->new_edges_;
    local_48 = &this->new_input_edge_ids_;
    local_50 = (vector<int,std::allocator<int>> *)&this->new_edge_layers_;
    uVar14 = (ulong)(int)uVar8;
    lVar12 = uVar14 * 8;
    lVar11 = uVar14 * 4;
    do {
      iVar5._M_current =
           (this->new_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      ppVar9 = (pair<int,_int> *)
               ((long)&((this->g_->edges_->
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->first + lVar12);
      if (iVar5._M_current ==
          (this->new_edges_).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>(local_40,iVar5,ppVar9);
      }
      else {
        *iVar5._M_current = *ppVar9;
        pppVar1 = &(this->new_edges_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      local_58 = *(int *)((long)(this->g_->input_edge_id_set_ids_->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar11);
      iVar6._M_current =
           (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_48,iVar6,&local_58);
      }
      else {
        *iVar6._M_current = local_58;
        (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      piVar10 = (int *)((long)(this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar11);
      iVar6._M_current =
           (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_50,iVar6,piVar10);
      }
      else {
        *iVar6._M_current = *piVar10;
        (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      uVar7 = uVar14 + 0x3f;
      if (-1 < (long)uVar14) {
        uVar7 = uVar14;
      }
      puVar2 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
               ((long)uVar7 >> 6) +
               (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
      *puVar2 = *puVar2 | 1L << ((byte)uVar14 & 0x3f);
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 8;
      lVar11 = lVar11 + 4;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar4 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = local_38;
  local_54 = local_34;
  pVar15 = std::
           __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                     (ppVar4 + piVar3[local_38],ppVar4 + piVar3[(long)local_38 + 1]);
  ppVar4 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (long)pVar15.second - (long)ppVar4;
  uVar8 = (int)uVar14 * 0x20000000 | (uint)((ulong)((long)pVar15.first - (long)ppVar4) >> 3);
  iVar13 = (int)(uVar14 >> 3) - uVar8;
  if (iVar13 != 0) {
    local_40 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->new_edges_;
    local_48 = &this->new_input_edge_ids_;
    local_50 = (vector<int,std::allocator<int>> *)&this->new_edge_layers_;
    uVar14 = (ulong)(int)uVar8;
    lVar12 = uVar14 * 8;
    lVar11 = uVar14 * 4;
    do {
      iVar5._M_current =
           (this->new_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      ppVar9 = (pair<int,_int> *)
               ((long)&((this->g_->edges_->
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->first + lVar12);
      if (iVar5._M_current ==
          (this->new_edges_).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>(local_40,iVar5,ppVar9);
      }
      else {
        *iVar5._M_current = *ppVar9;
        pppVar1 = &(this->new_edges_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      local_58 = *(int *)((long)(this->g_->input_edge_id_set_ids_->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar11);
      iVar6._M_current =
           (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_48,iVar6,&local_58);
      }
      else {
        *iVar6._M_current = local_58;
        (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      piVar10 = (int *)((long)(this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar11);
      iVar6._M_current =
           (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_50,iVar6,piVar10);
      }
      else {
        *iVar6._M_current = *piVar10;
        (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      uVar7 = uVar14 + 0x3f;
      if (-1 < (long)uVar14) {
        uVar7 = uVar14;
      }
      puVar2 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
               ((long)uVar7 >> 6) +
               (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
      *puVar2 = *puVar2 | 1L << ((byte)uVar14 & 0x3f);
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 8;
      lVar11 = lVar11 + 4;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  return;
}

Assistant:

void S2Builder::EdgeChainSimplifier::OutputAllEdges(VertexId v0, VertexId v1) {
  for (EdgeId e : out_.edge_ids(v0, v1)) OutputEdge(e);
  for (EdgeId e : out_.edge_ids(v1, v0)) OutputEdge(e);
}